

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Expression * __thiscall hdc::Parser::parse_shift_expression(Parser *this)

{
  bool bVar1;
  reference pTVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  Expression *local_48;
  Expression *expression;
  Token oper;
  Parser *this_local;
  
  oper._40_8_ = this;
  Token::Token((Token *)&expression);
  local_48 = parse_unary_expression(this);
  while( true ) {
    while( true ) {
      while (bVar1 = match(this,TK_SLL), bVar1) {
        pTVar2 = __gnu_cxx::
                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                 ::operator*(&this->matched);
        Token::operator=((Token *)&expression,pTVar2);
        pEVar3 = (Expression *)operator_new(0x68);
        pEVar4 = parse_unary_expression(this);
        ShiftLeftLogicalExpression::ShiftLeftLogicalExpression
                  ((ShiftLeftLogicalExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
        local_48 = pEVar3;
      }
      bVar1 = match(this,TK_SRL);
      if (!bVar1) break;
      pTVar2 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      Token::operator=((Token *)&expression,pTVar2);
      pEVar3 = (Expression *)operator_new(0x68);
      pEVar4 = parse_unary_expression(this);
      ShiftRightLogicalExpression::ShiftRightLogicalExpression
                ((ShiftRightLogicalExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
      local_48 = pEVar3;
    }
    bVar1 = match(this,TK_SRA);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    Token::operator=((Token *)&expression,pTVar2);
    pEVar3 = (Expression *)operator_new(0x68);
    pEVar4 = parse_unary_expression(this);
    ShiftRightArithmeticExpression::ShiftRightArithmeticExpression
              ((ShiftRightArithmeticExpression *)pEVar3,(Token *)&expression,local_48,pEVar4);
    local_48 = pEVar3;
  }
  Token::~Token((Token *)&expression);
  return local_48;
}

Assistant:

Expression* Parser::parse_shift_expression() {
    Token oper;
    Expression* expression = parse_unary_expression();

    while (true) {
        if (match(TK_SLL)) {
            oper = *matched;
            expression = new ShiftLeftLogicalExpression(oper, expression, parse_unary_expression());
        } else if (match(TK_SRL)) {
            oper = *matched;
            expression = new ShiftRightLogicalExpression(oper, expression, parse_unary_expression());
        } else if (match(TK_SRA)) {
            oper = *matched;
            expression = new ShiftRightArithmeticExpression(oper, expression, parse_unary_expression());
        } else {
            break;
        }
    }

    return expression;
}